

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall
t_php_generator::generate_php_struct(t_php_generator *this,t_struct *tstruct,bool is_exception)

{
  ofstream_with_content_based_conditional_update *this_00;
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  long *plVar3;
  ofstream_with_content_based_conditional_update *poVar4;
  string f_struct_name;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this_00 = &this->f_types_;
  if (this->classmap_ == false) {
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    std::operator+(&local_70,&this->package_dir_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar1));
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_40 = *plVar3;
      lStack_38 = plVar2[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar3;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_70,(char *)local_50,&local_71);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->f_types_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf(this_00);
    (this->f_types_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
    field_0x90 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    generate_program_header(this,(ostream *)this_00);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
  }
  poVar4 = this_00;
  generate_php_struct_definition(this,(ostream *)this_00,tstruct,is_exception,false);
  if (this->classmap_ == false) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (this_00,(int)poVar4);
  }
  return;
}

Assistant:

void t_php_generator::generate_php_struct(t_struct* tstruct, bool is_exception) {
  ofstream_with_content_based_conditional_update& f_struct = f_types_;
  if (!classmap_) {
    string f_struct_name = package_dir_ + tstruct->get_name() + ".php";
    f_struct.open(f_struct_name.c_str());
    generate_program_header(f_struct);
  }
  generate_php_struct_definition(f_struct, tstruct, is_exception);
  if (!classmap_) {
    f_struct.close();
  }
}